

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O3

cmValue __thiscall
cmStandardLevelResolver::CompileFeaturesAvailable
          (cmStandardLevelResolver *this,string *lang,string *error)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmGlobalGenerator *this_00;
  cmValue cVar3;
  ostream *poVar4;
  string *psVar5;
  char *pcVar6;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  ostringstream e;
  string local_230;
  pointer local_210;
  undefined8 local_208;
  undefined8 local_200;
  char *local_1f8;
  undefined8 local_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  size_type local_190;
  pointer local_188;
  undefined8 local_180;
  undefined8 local_178;
  char *local_170;
  undefined8 local_168;
  ios_base local_138 [264];
  
  this_00 = cmMakefile::GetGlobalGenerator(this->Makefile);
  bVar2 = cmGlobalGenerator::GetLanguageEnabled(this_00,lang);
  if (bVar2) {
    pcVar1 = this->Makefile;
    local_1a8._0_8_ = &DAT_00000006;
    local_1a8._8_8_ = "CMAKE_";
    local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_188 = (lang->_M_dataplus)._M_p;
    local_190 = lang->_M_string_length;
    local_180 = 0;
    local_178 = 0x11;
    local_170 = "_COMPILE_FEATURES";
    local_168 = 0;
    views._M_len = 3;
    views._M_array = (iterator)local_1a8;
    cmCatViews(&local_230,views);
    cVar3 = cmMakefile::GetDefinition(pcVar1,&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    if ((cVar3.Value != (string *)0x0) && ((cVar3.Value)->_M_string_length != 0)) {
      return (cmValue)cVar3.Value;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = "no";
    if (error == (string *)0x0) {
      pcVar6 = "No";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," known features for ",0x14);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," compiler\n\"",0xb);
    pcVar1 = this->Makefile;
    local_230._M_dataplus._M_p = &DAT_00000006;
    local_230._M_string_length = 0x7d5d93;
    local_230.field_2._M_allocated_capacity = 0;
    local_210 = (lang->_M_dataplus)._M_p;
    local_230.field_2._8_8_ = lang->_M_string_length;
    local_208 = 0;
    local_200 = 0xc;
    local_1f8 = "_COMPILER_ID";
    local_1f0 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_230;
    cmCatViews(&local_1c8,views_00);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1c8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"\nversion ",10);
    pcVar1 = this->Makefile;
    local_230._M_dataplus._M_p = &DAT_00000006;
    local_230._M_string_length = 0x7d5d93;
    local_230.field_2._M_allocated_capacity = 0;
    local_210 = (lang->_M_dataplus)._M_p;
    local_230.field_2._8_8_ = lang->_M_string_length;
    local_208 = 0;
    local_200 = 0x11;
    local_1f8 = "_COMPILER_VERSION";
    local_1f0 = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)&local_230;
    cmCatViews(&local_1e8,views_01);
    psVar5 = cmMakefile::GetSafeDefinition(pcVar1,&local_1e8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar4,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    local_230._M_dataplus._M_p._0_1_ = 0x2e;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)&local_230,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if (error == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_230);
      goto LAB_00225363;
    }
    std::__cxx11::stringbuf::str();
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pcVar6 = "cannot";
    if (error == (string *)0x0) {
      pcVar6 = "Cannot";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8," use features from non-enabled language ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,(lang->_M_dataplus)._M_p,lang->_M_string_length);
    if (error == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_230);
      goto LAB_00225363;
    }
    std::__cxx11::stringbuf::str();
  }
  std::__cxx11::string::operator=((string *)error,(string *)&local_230);
LAB_00225363:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return (cmValue)(string *)0x0;
}

Assistant:

cmValue cmStandardLevelResolver::CompileFeaturesAvailable(
  const std::string& lang, std::string* error) const
{
  if (!this->Makefile->GetGlobalGenerator()->GetLanguageEnabled(lang)) {
    std::ostringstream e;
    if (error) {
      e << "cannot";
    } else {
      e << "Cannot";
    }
    e << " use features from non-enabled language " << lang;
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }

  cmValue featuresKnown = this->Makefile->GetDefinition(
    cmStrCat("CMAKE_", lang, "_COMPILE_FEATURES"));

  if (!cmNonempty(featuresKnown)) {
    std::ostringstream e;
    if (error) {
      e << "no";
    } else {
      e << "No";
    }
    e << " known features for " << lang << " compiler\n\""
      << this->Makefile->GetSafeDefinition(
           cmStrCat("CMAKE_", lang, "_COMPILER_ID"))
      << "\"\nversion "
      << this->Makefile->GetSafeDefinition(
           cmStrCat("CMAKE_", lang, "_COMPILER_VERSION"))
      << '.';
    if (error) {
      *error = e.str();
    } else {
      this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    }
    return nullptr;
  }
  return featuresKnown;
}